

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  undefined4 uVar2;
  int r;
  float *pfVar3;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  bool bVar14;
  undefined4 uVar15;
  Matrix<float,_4,_3> res;
  undefined8 local_b8;
  float local_b0;
  float local_a8 [2];
  undefined8 uStack_a0;
  undefined8 local_98;
  float afStack_90 [4];
  Type in1;
  Matrix<float,_3,_4> retVal;
  Vector<float,_3> res_2;
  float fStack_34;
  undefined8 uStack_30;
  undefined1 local_28 [4];
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  Vector<float,_3> VStack_10;
  long lVar13;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar8 = (evalCtx->coords).m_data[0];
    fVar9 = (evalCtx->coords).m_data[1];
    fVar10 = (evalCtx->coords).m_data[2];
    fVar11 = (evalCtx->coords).m_data[3];
  }
  else {
    fVar8 = 1.4;
    fVar9 = 0.2;
    fVar10 = -0.5;
    fVar11 = 0.7;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_b8 = *(undefined8 *)(evalCtx->coords).m_data;
    local_b0 = (evalCtx->coords).m_data[2];
  }
  else {
    local_b8 = 0x3f000000be4ccccd;
    local_b0 = 0.8;
  }
  pfVar3 = local_a8;
  afStack_90[2] = 0.0;
  afStack_90[3] = 0.0;
  in1.m_data[0] = 0.0;
  in1.m_data[1] = 0.0;
  local_98 = 0;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  uStack_a0 = 0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar15 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar15 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar7) = uVar15;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x30);
    lVar6 = lVar6 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    fVar1 = *(float *)((long)&local_b8 + lVar5 * 4);
    local_a8[lVar5] = fVar1 * fVar8;
    *(float *)((long)&uStack_a0 + lVar5 * 4 + 4) = fVar1 * fVar9;
    afStack_90[lVar5] = fVar1 * fVar10;
    in1.m_data[lVar5 + -1] = fVar1 * fVar11;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  puVar4 = local_28;
  local_18 = 0;
  VStack_10.m_data[0] = 0.0;
  VStack_10.m_data[1] = 0.0;
  fStack_24 = 0.0;
  fStack_20 = 0.0;
  fStack_1c = 0.0;
  res_2.m_data[2] = 0.0;
  fStack_34 = 0.0;
  uStack_30 = 0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar12 = _DAT_00a99400;
    do {
      bVar14 = SUB164(auVar12 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar12 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar14) {
        uVar15 = 0x3f800000;
        if (lVar5 != lVar7) {
          uVar15 = 0;
        }
        *(undefined4 *)(puVar4 + lVar7 + -0x10) = uVar15;
      }
      if (bVar14) {
        uVar15 = 0x3f800000;
        if (lVar5 + -0x10 != lVar7) {
          uVar15 = 0;
        }
        *(undefined4 *)(puVar4 + lVar7) = uVar15;
      }
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    puVar4 = puVar4 + 4;
  } while (lVar6 != 4);
  lVar5 = 0;
  do {
    uVar15 = *(undefined4 *)((long)afStack_90 + lVar5);
    uVar2 = *(undefined4 *)((long)in1.m_data + lVar5 + -4);
    *(ulong *)(res_2.m_data + lVar5 + 2) =
         CONCAT44(*(undefined4 *)((long)&uStack_a0 + lVar5 + 4),
                  *(undefined4 *)((long)local_a8 + lVar5));
    *(ulong *)(local_28 + lVar5 * 4 + -8) = CONCAT44(uVar2,uVar15);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  retVal.m_data.m_data[3].m_data[1] = res_2.m_data[2];
  retVal.m_data.m_data[3].m_data[2] = fStack_34;
  res_2.m_data[0] = (float)uStack_30;
  retVal.m_data.m_data[2].m_data[0] = fStack_24;
  retVal.m_data.m_data[2].m_data[1] = fStack_20;
  retVal.m_data.m_data[2].m_data[2] = fStack_1c;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  lVar5 = 0;
  do {
    local_a8[lVar5] = res_2.m_data[lVar5 + -2] + (&res_2)[-2].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  retVal.m_data.m_data[0].m_data[2] = VStack_10.m_data[0];
  retVal.m_data.m_data[1].m_data[0] = VStack_10.m_data[1];
  retVal.m_data.m_data[1].m_data[1] = (float)local_18;
  stack0xffffffffffffff88 = 0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  lVar5 = 0;
  do {
    in1.m_data[lVar5 + 2] = local_a8[lVar5] + res_2.m_data[lVar5 + -10];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  uStack_a0 = 0x100000000;
  local_98 = CONCAT44(local_98._4_4_,2);
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a8[lVar5]] = in1.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}